

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O0

SeedType cppqc::detail::resolveSeed(SeedType originalSeed)

{
  char *pcVar1;
  time_t tVar2;
  SeedType in_EDI;
  ostringstream err;
  invalid_argument *anon_var_0;
  char *seed_from_env;
  size_t *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  allocator local_31;
  string local_30 [32];
  char *local_10;
  SeedType local_4;
  
  local_4 = in_EDI;
  if (in_EDI == 0xffffffff) {
    pcVar1 = getenv("CPPQUICKCHECK_SEED");
    local_10 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      tVar2 = time((time_t *)0x0);
      local_4 = (SeedType)tVar2;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,pcVar1,&local_31);
      local_4 = std::__cxx11::stoi(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
  }
  return local_4;
}

Assistant:

inline SeedType resolveSeed(SeedType originalSeed = USE_DEFAULT_SEED) {
  if (originalSeed == USE_DEFAULT_SEED) {
    const char* seed_from_env = std::getenv(CPPQUICKCHECK_SEED_ENV);
    if (seed_from_env != nullptr) {
      try {
        return static_cast<uint32_t>(std::stoi(seed_from_env));
      } catch (std::invalid_argument&) {
        std::ostringstream err;
        err << "Failed to parse seed in environment variable "
            << CPPQUICKCHECK_SEED_ENV << ": Got <" << seed_from_env
            << ">, but expected an integer between "
            << "0 and " << (USE_DEFAULT_SEED - 1)
            << ". To use a random seed instead, "
               "unset the environment variable.";
        throw std::invalid_argument{err.str()};
      }
    } else {
      return static_cast<SeedType>(std::time(0));
    }
  } else {
    return originalSeed;
  }
}